

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<double,__1,__1> __thiscall
Matrix<double,_-1,_-1>::operator+(Matrix<double,__1,__1> *this,Matrix<double,__1,__1> *matrix)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  double *pdVar5;
  double sum;
  int j;
  int i;
  Matrix<double,__1,__1> *matrix_local;
  Matrix<double,__1,__1> *this_local;
  Matrix<double,__1,__1> result;
  
  iVar2 = row(matrix);
  if (iVar2 != 0) {
    iVar2 = col(matrix);
    if (iVar2 != 0) {
      iVar2 = row(matrix);
      iVar3 = row(this);
      if (iVar2 == iVar3) {
        iVar2 = col(matrix);
        iVar3 = col(this);
        if (iVar2 == iVar3) {
          Matrix((Matrix<double,__1,__1> *)&this_local);
          iVar2 = row(matrix);
          iVar3 = col(matrix);
          resize((Matrix<double,__1,__1> *)&this_local,iVar2,iVar3);
          sum._4_4_ = 0;
          while( true ) {
            iVar2 = row(this);
            if (iVar2 <= sum._4_4_) break;
            sum._0_4_ = 0;
            while( true ) {
              iVar2 = col(this);
              if (iVar2 <= sum._0_4_) break;
              pdVar5 = operator()(this,sum._4_4_,sum._0_4_);
              dVar1 = *pdVar5;
              pdVar5 = operator()(matrix,sum._4_4_,sum._0_4_);
              SetElement((Matrix<double,__1,__1> *)&this_local,sum._4_4_,sum._0_4_,dVar1 + *pdVar5);
              sum._0_4_ = sum._0_4_ + 1;
            }
            sum._4_4_ = sum._4_4_ + 1;
          }
          return _this_local;
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"can not plus matrix with different rows/cols")
      ;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"can not plus two empty matrix!");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

Matrix<Type, _0, _1> Matrix<Type, _0, _1>::operator+(const Matrix<Type, _0, _1> &matrix)
{
    if(matrix.row() == 0 || matrix.col() == 0)
    {
        cerr << "can not plus two empty matrix!" << endl;
        exit(-1);
    }
    if(matrix.row() != this->row() || 
       matrix.col() != this->col())
    {
        cerr << "can not plus matrix with different rows/cols" << endl;
        exit(-1);
    }

    Matrix<Type, _0, _1> result;
    if(_0 == Dynamic || _1 == Dynamic) 
        result.resize(matrix.row(), matrix.col());    

    for(int i = 0; i < this->row(); ++i)
        for(int j = 0; j < this->col(); ++j)
        {
            Type sum = this->operator()(i, j) + matrix(i, j);
            result.SetElement(i, j, sum);
        }
    return result;
}